

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O0

void __thiscall ui::Led::TriggerTimer(Led *this)

{
  string local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_ofstream<char,_std::char_traits<char>_> local_680 [512];
  string local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_ofstream<char,_std::char_traits<char>_> local_440 [528];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_ofstream<char,_std::char_traits<char>_> local_210 [512];
  Led *local_10;
  Led *this_local;
  
  local_10 = this;
  std::operator+(&local_230,&this->file_path_,"/trigger");
  std::ofstream::ofstream(local_210,(string *)&local_230,_S_out);
  std::operator<<(local_210,(char (*) [6])"timer");
  std::ofstream::~ofstream(local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::operator+(&local_460,&this->file_path_,"/delay_on");
  std::ofstream::ofstream(local_440,(string *)&local_460,_S_out);
  std::__cxx11::to_string(&local_480,(int)(this->ratio_ * (float)this->period_));
  std::operator<<(local_440,&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  std::ofstream::~ofstream(local_440);
  std::__cxx11::string::~string((string *)&local_460);
  std::operator+(&local_6a0,&this->file_path_,"/delay_off");
  std::ofstream::ofstream(local_680,(string *)&local_6a0,_S_out);
  std::__cxx11::to_string(&local_6c0,(int)((1.0 - this->ratio_) * (float)this->period_));
  std::operator<<(local_680,&local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::ofstream::~ofstream(local_680);
  std::__cxx11::string::~string((string *)&local_6a0);
  FetchState(this);
  return;
}

Assistant:

void TriggerTimer() {
    std::ofstream(file_path_ + "/trigger") << "timer";
    std::ofstream(file_path_ + "/delay_on")
        << std::to_string(int(ratio_ * period_));
    std::ofstream(file_path_ + "/delay_off")
        << std::to_string(int((1.f - ratio_) * period_));
    FetchState();
  }